

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zone.cpp
# Opt level: O3

void __thiscall
asmjit::v1_14::Zone::_init(Zone *this,size_t blockSize,size_t blockAlignment,Temporary *temporary)

{
  void *__ptr;
  void *pvVar1;
  long lVar2;
  Zone ZVar3;
  int iVar4;
  undefined8 *puVar5;
  undefined8 *puVar6;
  long lVar7;
  bool bVar8;
  
  if (blockSize < 0x100) {
    _init();
LAB_0012a676:
    _init();
  }
  else {
    if (0x8000000000000000 < blockSize) goto LAB_0012a676;
    if (blockAlignment < 0x41) {
      *(char **)this =
           "/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/core/zone.cpp"
      ;
      *(char **)(this + 8) =
           "/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/core/zone.cpp"
      ;
      *(undefined1 **)(this + 0x10) = _zeroBlock;
      lVar7 = 0x3f;
      if (blockSize != 0) {
        for (; blockSize >> lVar7 == 0; lVar7 = lVar7 + -1) {
        }
      }
      lVar2 = 0x3f;
      if ((blockAlignment | 8) != 0) {
        for (; (blockAlignment | 8) >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      ZVar3 = (Zone)(0x40 - ((byte)lVar2 ^ 0x3f));
      this[0x18] = ZVar3;
      this[0x19] = (Zone)('@' - ((byte)lVar7 ^ 0x3f));
      this[0x1a] = (Zone)0x19;
      bVar8 = temporary == (Temporary *)0x0;
      this[0x1b] = (Zone)!bVar8;
      *(undefined4 *)(this + 0x1c) = 0;
      *(ulong *)(this + 0x20) = (ulong)!bVar8;
      if (bVar8) {
        return;
      }
      puVar5 = (undefined8 *)temporary->_data;
      *puVar5 = 0;
      puVar5[1] = 0;
      blockSize = temporary->_size;
      if (0x17 < blockSize) {
        puVar5[2] = blockSize - 0x18;
        lVar7 = 1L << ((byte)ZVar3 & 0x3f);
        *(long *)this = -lVar7 & (long)puVar5 + lVar7 + 0x17;
        *(size_t *)(this + 8) = blockSize + (long)puVar5;
        *(undefined8 **)(this + 0x10) = puVar5;
        *(undefined8 *)(this + 0x20) = 1;
        return;
      }
      goto LAB_0012a680;
    }
  }
  _init();
LAB_0012a680:
  iVar4 = (int)blockSize;
  _init();
  puVar5 = *(undefined8 **)(this + 0x10);
  if (puVar5 != (undefined8 *)_zeroBlock) {
    if (iVar4 == 1) {
      ZVar3 = this[0x1b];
      *(char **)this =
           "/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/core/zone.cpp"
      ;
      *(char **)(this + 8) =
           "/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/core/zone.cpp"
      ;
      *(undefined1 **)(this + 0x10) = _zeroBlock;
      *(ulong *)(this + 0x20) = (ulong)(ZVar3 != (Zone)0x0);
      __ptr = (void *)puVar5[1];
      do {
        puVar6 = (undefined8 *)*puVar5;
        if (puVar6 == (undefined8 *)0x0 && ZVar3 != (Zone)0x0) {
          *puVar5 = 0;
          puVar5[1] = 0;
          lVar7 = 1L << ((byte)this[0x18] & 0x3f);
          *(long *)this = -lVar7 & (long)puVar5 + lVar7 + 0x17;
          *(long *)(this + 8) = (long)puVar5 + puVar5[2] + 0x18;
          *(undefined8 **)(this + 0x10) = puVar5;
          break;
        }
        free(puVar5);
        puVar5 = puVar6;
      } while (puVar6 != (undefined8 *)0x0);
      while (__ptr != (void *)0x0) {
        pvVar1 = *(void **)((long)__ptr + 8);
        free(__ptr);
        __ptr = pvVar1;
      }
    }
    else {
      do {
        puVar6 = puVar5;
        puVar5 = (undefined8 *)*puVar6;
      } while ((undefined8 *)*puVar6 != (undefined8 *)0x0);
      lVar7 = 1L << ((byte)this[0x18] & 0x3f);
      *(long *)this = -lVar7 & (long)puVar6 + lVar7 + 0x17;
      *(long *)(this + 8) = (long)puVar6 + puVar6[2] + 0x18;
      *(undefined8 **)(this + 0x10) = puVar6;
    }
  }
  return;
}

Assistant:

void Zone::_init(size_t blockSize, size_t blockAlignment, const Support::Temporary* temporary) noexcept {
  ASMJIT_ASSERT(blockSize >= kMinBlockSize);
  ASMJIT_ASSERT(blockSize <= kMaxBlockSize);
  ASMJIT_ASSERT(blockAlignment <= 64);

  Zone_assignZeroBlock(this);

  size_t blockSizeShift = Support::bitSizeOf<size_t>() - Support::clz(blockSize);
  size_t blockAlignmentShift = Support::bitSizeOf<size_t>() - Support::clz(blockAlignment | (size_t(1) << 3));

  _blockAlignmentShift = uint8_t(blockAlignmentShift);
  _minimumBlockSizeShift = uint8_t(blockSizeShift);
  _maximumBlockSizeShift = uint8_t(25); // (1 << 25) Equals 32 MiB blocks (should be enough for all cases)
  _hasStaticBlock = uint8_t(temporary != nullptr);
  _reserved = uint8_t(0u);
  _blockCount = size_t(temporary != nullptr);

  // Setup the first [temporary] block, if necessary.
  if (temporary) {
    Block* block = temporary->data<Block>();
    block->prev = nullptr;
    block->next = nullptr;

    ASMJIT_ASSERT(temporary->size() >= kBlockSize);
    block->size = temporary->size() - kBlockSize;

    Zone_assignBlock(this, block);
    _blockCount = 1u;
  }
}